

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O1

void __thiscall
HdlcAnalyzerResults::GenControlFieldString
          (HdlcAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  HdlcFrameType HVar1;
  size_t sVar2;
  HdlcAnalyzerResults *this_00;
  char *pcVar3;
  string escStr;
  char ctlNumStr [64];
  char byteStr [64];
  stringstream ss;
  char *local_278 [2];
  char local_268 [16];
  string local_258;
  char local_238 [64];
  char local_1f8 [64];
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x10),display_base,8,local_1f8,0x40);
  this_00 = (HdlcAnalyzerResults *)0x1;
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x18),Decimal,8,local_238,0x40);
  GenEscapedString_abi_cxx11_(&local_258,this_00,frame);
  if (*(long *)(frame + 0x18) == 0) {
    HVar1 = HdlcAnalyzer::GetFrameType((U8)frame[0x10]);
    if (HVar1 < 4) {
      pcVar3 = (&PTR_anon_var_dwarf_cad3_00112d38)[HVar1];
    }
    else {
      pcVar3 = (char *)0x0;
    }
  }
  else {
    pcVar3 = "";
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"CTL",3);
  sVar2 = strlen(local_238);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," [",2);
  if (tabular) {
    local_278[0] = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"");
    std::__cxx11::stringbuf::str(local_1a0);
    if (local_278[0] != local_268) {
      operator_delete(local_278[0]);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Control",7);
    sVar2 = strlen(local_238);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," [",2);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddTabularText
              ((char *)this,local_278[0],local_1f8,"]",pcVar3,local_258._M_dataplus._M_p);
  }
  else {
    AnalyzerResults::AddResultString((char *)this,"C",local_238,(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    AnalyzerResults::AddResultString
              ((char *)this,"CTL",local_238,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_278[0],local_1f8,"]",local_258._M_dataplus._M_p,(char *)0x0);
    if (local_278[0] != local_268) {
      operator_delete(local_278[0]);
    }
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_278[0],local_1f8,"]",pcVar3,local_258._M_dataplus._M_p);
    if (local_278[0] != local_268) {
      operator_delete(local_278[0]);
    }
    local_278[0] = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"");
    std::__cxx11::stringbuf::str(local_1a0);
    if (local_278[0] != local_268) {
      operator_delete(local_278[0]);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Control",7);
    sVar2 = strlen(local_238);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_238,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," [",2);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_278[0],local_1f8,"]",pcVar3,local_258._M_dataplus._M_p);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0]);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HdlcAnalyzerResults::GenControlFieldString( const Frame& frame, DisplayBase display_base, bool tabular )
{
    char byteStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, byteStr, 64 );

    char ctlNumStr[ 64 ];
    AnalyzerHelpers::GetNumberString( frame.mData2, Decimal, 8, ctlNumStr, 64 );

    string escStr = GenEscapedString( frame );

    char* frameTypeStr = 0;
    if( frame.mData2 != 0 )
    {
        frameTypeStr = "";
    }
    else
    {
        switch( HdlcAnalyzer::GetFrameType( frame.mData1 ) )
        {
        case HDLC_I_FRAME:
            frameTypeStr = " - I-Frame";
            break;
        case HDLC_S_FRAME:
            frameTypeStr = " - S-Frame";
            break;
        case HDLC_U_FRAME:
            frameTypeStr = " - U-Frame";
            break;
        }
    }

    stringstream ss;
    ss << "CTL" << ctlNumStr << " [";

    if( !tabular )
    {
        AddResultString( "C", ctlNumStr );
        AddResultString( "CTL", ctlNumStr );
        AddResultString( ss.str().c_str(), byteStr, "]", escStr.c_str() );
        AddResultString( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
        ss.str( "" );
        ss << "Control" << ctlNumStr << " [";

        AddResultString( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
    }
    else
    {
        ss.str( "" );
        ss << "Control" << ctlNumStr << " [";
        AddTabularText( ss.str().c_str(), byteStr, "]", frameTypeStr, escStr.c_str() );
    }
}